

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Reprint(lemon *lemp)

{
  int iVar1;
  symbol **ppsVar2;
  rule *prVar3;
  symbol *psVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  iVar1 = lemp->nsymbol;
  if ((long)iVar1 < 1) {
    iVar7 = 5;
    uVar11 = 10;
  }
  else {
    ppsVar2 = lemp->symbols;
    uVar11 = 10;
    lVar9 = 0;
    do {
      sVar6 = strlen(ppsVar2[lVar9]->name);
      uVar5 = (uint)sVar6;
      if ((int)(uint)sVar6 < (int)uVar11) {
        uVar5 = uVar11;
      }
      uVar11 = uVar5;
      lVar9 = lVar9 + 1;
    } while (iVar1 != lVar9);
    iVar7 = 1;
    if (uVar11 < 0x48) {
      iVar7 = (int)(0x4c / (ulong)(uVar11 + 5));
    }
  }
  uVar8 = (long)(iVar1 + iVar7 + -1) / (long)iVar7;
  if (0 < (int)uVar8) {
    uVar8 = uVar8 & 0xffffffff;
    uVar13 = 0;
    do {
      printf("//");
      uVar10 = uVar13;
      if ((int)uVar13 < lemp->nsymbol) {
        do {
          if (uVar10 != (uint)lemp->symbols[uVar10]->index) {
            __assert_fail("sp->index==j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0xbc8,"void Reprint(struct lemon *)");
          }
          printf(" %3d %-*.*s",uVar10 & 0xffffffff,(ulong)uVar11,(ulong)uVar11,
                 lemp->symbols[uVar10]->name);
          uVar10 = uVar10 + uVar8;
        } while ((int)uVar10 < lemp->nsymbol);
      }
      putchar(10);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar8);
  }
  for (prVar3 = lemp->rule; prVar3 != (rule *)0x0; prVar3 = prVar3->next) {
    printf("%s",prVar3->lhs->name);
    printf(" ::=");
    if (0 < prVar3->nrhs) {
      lVar9 = 0;
      do {
        psVar4 = prVar3->rhs[lVar9];
        if (psVar4->type == MULTITERMINAL) {
          printf(" %s",(*psVar4->subsym)->name);
          if (1 < psVar4->nsubsym) {
            lVar12 = 1;
            do {
              printf("|%s",psVar4->subsym[lVar12]->name);
              lVar12 = lVar12 + 1;
            } while (lVar12 < psVar4->nsubsym);
          }
        }
        else {
          printf(" %s",psVar4->name);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < prVar3->nrhs);
    }
    putchar(0x2e);
    if (prVar3->precsym != (symbol *)0x0) {
      printf(" [%s]",prVar3->precsym->name);
    }
    putchar(10);
  }
  return;
}

Assistant:

void Reprint(struct lemon *lemp)
{
  struct rule *rp;
  struct symbol *sp;
  int i, j, maxlen, len, ncolumns, skip;
  printf("// Reprint of input file \"%s\".\n// Symbols:\n",lemp->filename);
  maxlen = 10;
  for(i=0; i<lemp->nsymbol; i++){
    sp = lemp->symbols[i];
    len = lemonStrlen(sp->name);
    if( len>maxlen ) maxlen = len;
  }
  ncolumns = 76/(maxlen+5);
  if( ncolumns<1 ) ncolumns = 1;
  skip = (lemp->nsymbol + ncolumns - 1)/ncolumns;
  for(i=0; i<skip; i++){
    printf("//");
    for(j=i; j<lemp->nsymbol; j+=skip){
      sp = lemp->symbols[j];
      assert( sp->index==j );
      printf(" %3d %-*.*s",j,maxlen,maxlen,sp->name);
    }
    printf("\n");
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    printf("%s",rp->lhs->name);
    /*    if( rp->lhsalias ) printf("(%s)",rp->lhsalias); */
    printf(" ::=");
    for(i=0; i<rp->nrhs; i++){
      sp = rp->rhs[i];
      if( sp->type==MULTITERMINAL ){
        printf(" %s", sp->subsym[0]->name);
        for(j=1; j<sp->nsubsym; j++){
          printf("|%s", sp->subsym[j]->name);
        }
      }else{
        printf(" %s", sp->name);
      }
      /* if( rp->rhsalias[i] ) printf("(%s)",rp->rhsalias[i]); */
    }
    printf(".");
    if( rp->precsym ) printf(" [%s]",rp->precsym->name);
    /* if( rp->code ) printf("\n    %s",rp->code); */
    printf("\n");
  }
}